

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.hh
# Opt level: O0

void __thiscall
tinyusdz::tydra::TerminalAttributeValue::~TerminalAttributeValue(TerminalAttributeValue *this)

{
  TerminalAttributeValue *this_local;
  
  AttrMetas::~AttrMetas(&this->_meta);
  tinyusdz::value::Value::~Value(&this->_value);
  ::std::__cxx11::string::~string((string *)&this->_type_name);
  return;
}

Assistant:

TerminalAttributeValue() = default;